

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O0

_Bool apprun_shebang_requires_external_executable(char *shebang,char *appdir)

{
  _Bool _Var1;
  char *path;
  char *interp_path;
  _Bool requires_external_interpreter;
  char *appdir_local;
  char *shebang_local;
  
  interp_path._7_1_ = false;
  if (shebang != (char *)0x0) {
    path = apprun_shebang_extract_interpreter_path(shebang);
    if ((path != (char *)0x0) && (*path == '/')) {
      _Var1 = apprun_is_path_child_of(path,appdir);
      interp_path._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
    }
    free(path);
  }
  return interp_path._7_1_;
}

Assistant:

bool apprun_shebang_requires_external_executable(const char* shebang, const char* appdir) {
    bool requires_external_interpreter = false;
    if (shebang != NULL) {
        char* interp_path = apprun_shebang_extract_interpreter_path(shebang);
        if (interp_path != NULL) {
            if (interp_path[0] == '/')
                requires_external_interpreter = !apprun_is_path_child_of(interp_path, appdir);

            // relative path will be treated as relative to the runtime dir on execution
        }

        free(interp_path);
    }

    return requires_external_interpreter;
}